

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PEFile.cpp
# Opt level: O2

void __thiscall PEFile::PEFile(PEFile *this,AbstractByteBuffer *v_buf)

{
  MappedExe::MappedExe(&this->super_MappedExe,v_buf,BITS_32);
  (this->super_MappedExe).super_Executable.super_AbstractByteBuffer._vptr_AbstractByteBuffer =
       (_func_int **)&PTR__PEFile_0014cfe8;
  (this->super_MappedExe).super_ExeWrappersContainer._vptr_ExeWrappersContainer =
       (_func_int **)&PTR__PEFile_0014d108;
  (this->core)._vptr_PECore = (_func_int **)&PTR__PECore_00151d38;
  (this->m_peMutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
  (this->core).buf = (AbstractByteBuffer *)0x0;
  (this->core).dos = (IMAGE_DOS_HEADER *)0x0;
  (this->core).fHdr = (IMAGE_FILE_HEADER *)0x0;
  (this->core).opt32 = (IMAGE_OPTIONAL_HEADER32 *)0x0;
  (this->core).opt64 = (IMAGE_OPTIONAL_HEADER64 *)0x0;
  this->dosHdrWrapper = (DosHdrWrapper *)0x0;
  this->fHdr = (FileHdrWrapper *)0x0;
  this->optHdr = (OptHdrWrapper *)0x0;
  this->sects = (SectHdrsWrapper *)0x0;
  this->album = (ResourcesAlbum *)0x0;
  clearWrappers(this);
  _init(this,v_buf);
  Logger::append(D_INFO,"Wrapped");
  return;
}

Assistant:

PEFile::PEFile(AbstractByteBuffer *v_buf)
    : MappedExe(v_buf, Executable::BITS_32), 
    dosHdrWrapper(NULL), fHdr(NULL), optHdr(NULL), sects(NULL),
    album(NULL)
{
    clearWrappers();

    _init(v_buf);
    Logger::append(Logger::D_INFO,"Wrapped");
}